

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O1

void __thiscall ImPlotStyle::ImPlotStyle(ImPlotStyle *this)

{
  memset(&this->MajorTickLen,0,0x1f8);
  this->LineWeight = 1.0;
  this->Marker = -1;
  this->MarkerSize = 4.0;
  this->MarkerWeight = 1.0;
  this->FillAlpha = 1.0;
  this->ErrorBarSize = 5.0;
  this->ErrorBarWeight = 1.5;
  this->DigitalBitHeight = 8.0;
  this->DigitalBitGap = 4.0;
  this->PlotBorderSize = 1.0;
  this->MinorAlpha = 0.25;
  (this->MajorTickLen).x = 10.0;
  *(undefined8 *)&(this->MajorTickLen).y = 0x40a0000041200000;
  *(undefined8 *)&(this->MinorTickLen).y = 0x3f80000040a00000;
  *(undefined8 *)&(this->MajorTickSize).y = 0x3f8000003f800000;
  *(undefined8 *)&(this->MinorTickSize).y = 0x3f8000003f800000;
  *(undefined8 *)&(this->MajorGridSize).y = 0x3f8000003f800000;
  *(undefined8 *)&(this->MinorGridSize).y = 0x412000003f800000;
  *(undefined8 *)&(this->PlotPadding).y = 0x40a0000041200000;
  *(undefined8 *)&(this->LabelPadding).y = 0x4120000040a00000;
  *(undefined8 *)&(this->LegendPadding).y = 0x40a0000041200000;
  *(undefined8 *)&(this->LegendInnerPadding).y = 0x40a00000;
  *(undefined8 *)&(this->LegendSpacing).y = 0x4120000000000000;
  *(undefined8 *)&(this->MousePosPadding).y = 0x4000000041200000;
  *(undefined8 *)&(this->AnnotationPadding).y = 0x43c8000040000000;
  *(undefined8 *)&(this->PlotDefaultSize).y = 0x4396000043960000;
  (this->PlotMinSize).y = 225.0;
  ImPlot::StyleColorsAuto(this);
  this->AntiAliasedLines = false;
  this->UseLocalTime = false;
  this->UseISO8601 = false;
  this->Use24HourClock = false;
  return;
}

Assistant:

ImPlotStyle::ImPlotStyle() {

    LineWeight         = 1;
    Marker             = ImPlotMarker_None;
    MarkerSize         = 4;
    MarkerWeight       = 1;
    FillAlpha          = 1;
    ErrorBarSize       = 5;
    ErrorBarWeight     = 1.5f;
    DigitalBitHeight   = 8;
    DigitalBitGap      = 4;

    PlotBorderSize     = 1;
    MinorAlpha         = 0.25f;
    MajorTickLen       = ImVec2(10,10);
    MinorTickLen       = ImVec2(5,5);
    MajorTickSize      = ImVec2(1,1);
    MinorTickSize      = ImVec2(1,1);
    MajorGridSize      = ImVec2(1,1);
    MinorGridSize      = ImVec2(1,1);
    PlotPadding        = ImVec2(10,10);
    LabelPadding       = ImVec2(5,5);
    LegendPadding      = ImVec2(10,10);
    LegendInnerPadding = ImVec2(5,5);
    LegendSpacing      = ImVec2(0,0);
    MousePosPadding    = ImVec2(10,10);
    AnnotationPadding  = ImVec2(2,2);
    PlotDefaultSize    = ImVec2(400,300);
    PlotMinSize        = ImVec2(300,225);

    ImPlot::StyleColorsAuto(this);

    AntiAliasedLines = false;
    UseLocalTime     = false;
    Use24HourClock   = false;
    UseISO8601       = false;
}